

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signed-interest.c
# Opt level: O0

int ndn_signed_interest_hmac_sign
              (ndn_interest_t *interest,ndn_name_t *identity,ndn_hmac_key_t *hmac_key)

{
  _Bool _Var1;
  int iVar2;
  uint32_t local_2fc;
  int result;
  uint32_t used_bytes;
  uint32_t siginfo_block_ending;
  uint32_t param_block_starting;
  size_t i;
  ndn_encoder_t temp_encoder;
  uint8_t be_signed [680];
  int ret_val;
  ndn_hmac_key_t *hmac_key_local;
  ndn_name_t *identity_local;
  ndn_interest_t *interest_local;
  
  if ((interest->name).components_size + 1 < 0xb) {
    _prepare_signature_info(interest,'\x04',identity,hmac_key->key_id);
    memset(&temp_encoder.output_max_size,0,0x2a8);
    encoder_init((ndn_encoder_t *)&i,(uint8_t *)&temp_encoder.output_max_size,0x2a8);
    for (_siginfo_block_ending = 0; _siginfo_block_ending < (interest->name).components_size;
        _siginfo_block_ending = _siginfo_block_ending + 1) {
      iVar2 = name_component_tlv_encode
                        ((ndn_encoder_t *)&i,(interest->name).components + _siginfo_block_ending);
      if (iVar2 != 0) {
        return iVar2;
      }
    }
    used_bytes = temp_encoder.output_value._4_4_;
    _Var1 = ndn_interest_has_Parameters(interest);
    if (((!_Var1) ||
        (((interest_local._4_4_ = encoder_append_type((ndn_encoder_t *)&i,0x24),
          interest_local._4_4_ == 0 &&
          (interest_local._4_4_ =
                encoder_append_length((ndn_encoder_t *)&i,(interest->parameters).size),
          interest_local._4_4_ == 0)) &&
         (interest_local._4_4_ =
               encoder_append_raw_buffer_value
                         ((ndn_encoder_t *)&i,(interest->parameters).value,
                          (interest->parameters).size), interest_local._4_4_ == 0)))) &&
       (interest_local._4_4_ =
             ndn_signature_info_tlv_encode((ndn_encoder_t *)&i,&interest->signature),
       interest_local._4_4_ == 0)) {
      result = temp_encoder.output_value._4_4_;
      local_2fc = 0;
      interest_local._4_4_ =
           ndn_hmac_sign((uint8_t *)i,temp_encoder.output_value._4_4_,
                         (interest->signature).sig_value,0x80,hmac_key,&local_2fc);
      if (-1 < interest_local._4_4_) {
        (interest->signature).sig_size = local_2fc;
        interest_local._4_4_ =
             ndn_signature_value_tlv_encode((ndn_encoder_t *)&i,&interest->signature);
        if ((interest_local._4_4_ == 0) &&
           (interest_local._4_4_ =
                 ndn_sha256((uint8_t *)(i + used_bytes),temp_encoder.output_value._4_4_ - used_bytes
                            ,(interest->name).components[(interest->name).components_size].value),
           -1 < interest_local._4_4_)) {
          (interest->name).components[(interest->name).components_size].type = 2;
          (interest->name).components[(interest->name).components_size].size = ' ';
          (interest->name).components_size = (interest->name).components_size + '\x01';
          interest->flags = interest->flags | 0x80;
          interest_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    interest_local._4_4_ = -10;
  }
  return interest_local._4_4_;
}

Assistant:

int
ndn_signed_interest_hmac_sign(ndn_interest_t* interest,
                              const ndn_name_t* identity, const ndn_hmac_key_t* hmac_key)
{
  int ret_val = -1;
  if (interest->name.components_size + 1 > NDN_NAME_COMPONENTS_SIZE)
    return NDN_OVERSIZE;

  // set signature info
  _prepare_signature_info(interest, NDN_SIG_TYPE_HMAC_SHA256, identity, hmac_key->key_id);

  // update signature value and append the ending name component
  // prepare temp buffer to calculate signature value and the ending name component
  uint8_t be_signed[NDN_SIGNED_INTEREST_BE_SIGNED_MAX_SIZE] = {0};
  ndn_encoder_t temp_encoder;
  encoder_init(&temp_encoder, be_signed, NDN_SIGNED_INTEREST_BE_SIGNED_MAX_SIZE);
  // the signing input starts at Name's Value (V)
  for (size_t i = 0; i < interest->name.components_size; i++) {
    ret_val = name_component_tlv_encode(&temp_encoder, &interest->name.components[i]);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  // the digest input starts at parameters
  uint32_t param_block_starting = temp_encoder.offset;
  if (ndn_interest_has_Parameters(interest)) {
    ret_val = encoder_append_type(&temp_encoder, TLV_ApplicationParameters);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_length(&temp_encoder, interest->parameters.size);
    if (ret_val != NDN_SUCCESS) return ret_val;
    ret_val = encoder_append_raw_buffer_value(&temp_encoder, interest->parameters.value, interest->parameters.size);
    if (ret_val != NDN_SUCCESS) return ret_val;
  }
  ret_val = ndn_signature_info_tlv_encode(&temp_encoder, &interest->signature);
  if (ret_val != NDN_SUCCESS) return ret_val;
  // the signing input ends at signature info
  uint32_t siginfo_block_ending = temp_encoder.offset;

  // calculate signature
  // signature is calculated over Name + Parameters + SignatureInfo
  uint32_t used_bytes = 0;
  int result = NDN_SUCCESS;
  result = ndn_hmac_sign(temp_encoder.output_value, siginfo_block_ending,
                         interest->signature.sig_value, NDN_SIGNATURE_BUFFER_SIZE,
                         hmac_key, &used_bytes);
  if (result < 0) return result;
  interest->signature.sig_size = used_bytes;

  ret_val = ndn_signature_value_tlv_encode(&temp_encoder, &interest->signature);
  if (ret_val != NDN_SUCCESS) return ret_val;

  // calculate the SignedInterestSha256DigestComponent
  // component is calculated over Name + Parameters + SignatureInfo + SignatureValue
  result = ndn_sha256(&temp_encoder.output_value[param_block_starting],
                      temp_encoder.offset - param_block_starting,
                      interest->name.components[interest->name.components_size].value);
  if (result < 0) return result;
  interest->name.components[interest->name.components_size].type = TLV_ParametersSha256DigestComponent;
  interest->name.components[interest->name.components_size].size = NDN_SEC_SHA256_HASH_SIZE;
  interest->name.components_size++;
  BIT_SET(interest->flags, 7);
  return NDN_SUCCESS;
}